

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_ErrorMgr.cpp
# Opt level: O0

ErrorProvider * __thiscall axl::err::ErrorMgr::findProvider(ErrorMgr *this,Guid *guid)

{
  void *pvVar1;
  HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *pHVar2;
  HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
  *in_RDI;
  HashTableIterator<axl::sl::Guid,_axl::err::ErrorProvider_*> it;
  ScopeLock scopeLock;
  Lock *in_stack_ffffffffffffff98;
  ScopeLock *in_stack_ffffffffffffffa0;
  ErrorProvider *pEVar3;
  Guid *in_stack_ffffffffffffffb0;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
  local_20 [4];
  
  sys::ScopeLock::ScopeLock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  sl::
  HashTable<axl::sl::Guid,_axl::err::ErrorProvider_*,_axl::sl::HashDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_axl::sl::EqDuckType<axl::sl::Guid,_const_axl::sl::Guid_&>,_const_axl::sl::Guid_&,_axl::err::ErrorProvider_*>
  ::find(in_RDI,in_stack_ffffffffffffffb0);
  sl::HashTableIterator<axl::sl::Guid,_axl::err::ErrorProvider_*>::HashTableIterator
            ((HashTableIterator<axl::sl::Guid,_axl::err::ErrorProvider_*> *)
             in_stack_ffffffffffffffa0,
             (Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
              *)in_stack_ffffffffffffff98);
  pvVar1 = sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_20);
  if (pvVar1 == (void *)0x0) {
    pEVar3 = (ErrorProvider *)0x0;
  }
  else {
    pHVar2 = sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::ListLink>_>
             ::operator->(local_20);
    pEVar3 = (pHVar2->super_MapEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>).m_value;
  }
  sys::ScopeLock::~ScopeLock((ScopeLock *)0x1331b4);
  return pEVar3;
}

Assistant:

ErrorProvider*
ErrorMgr::findProvider(const sl::Guid& guid) {
	sys::ScopeLock scopeLock(&m_lock);
	sl::HashTableIterator<sl::Guid, ErrorProvider*> it = m_providerMap.find(guid);
	return it ? it->m_value : NULL;
}